

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
checkIntLiteralRange
          (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
           *this,bool isNegative)

{
  bool bVar1;
  CompileMessage CStack_58;
  
  bVar1 = TokenType::operator==(&this->literalType,(TokenType *)&Token::literalInt32);
  if (bVar1) {
    if (isNegative) {
      if (this->literalIntValue < 0x80000001) goto LAB_00293955;
      Errors::integerLiteralNeedsSuffix<>();
      (*this->_vptr_Tokeniser[2])(this,&CStack_58);
    }
    else {
      if (this->literalIntValue < 0x80000000) goto LAB_00293955;
      Errors::integerLiteralNeedsSuffix<>();
      (*this->_vptr_Tokeniser[2])(this,&CStack_58);
    }
    CompileMessage::~CompileMessage(&CStack_58);
  }
LAB_00293955:
  return (TokenType)(this->literalType).text;
}

Assistant:

TokenType checkIntLiteralRange (bool isNegative)
    {
        if (literalType == Token::literalInt32)
        {
            if (isNegative && literalIntValue > -static_cast<int64_t> (std::numeric_limits<int32_t>::min()))
                throwError (Errors::integerLiteralNeedsSuffix());

            if (! isNegative && literalIntValue > static_cast<int64_t> (std::numeric_limits<int32_t>::max()))
                throwError (Errors::integerLiteralNeedsSuffix());
        }

        return literalType;
    }